

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * anon_unknown.dwarf_dd40c::readSnippet(string *__return_storage_ptr__,string *snippetFile)

{
  allocator<char> local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  ostringstream oss;
  ifstream ifs;
  streambuf local_208 [16];
  byte abStack_1f8 [488];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp",
             &local_3d1);
  std::operator+(&local_3b0,&local_3d0,"/snippets/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 &local_3b0,snippetFile);
  std::ifstream::ifstream(&ifs,(string *)&oss,_S_in);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  if ((abStack_1f8[*(long *)(_ifs + -0x18)] & 5) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::ostream::operator<<((ostream *)&oss,local_208);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    std::ifstream::~ifstream(&ifs);
    return __return_storage_ptr__;
  }
  __assert_fail("!ifs.fail()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x42d2,"std::string (anonymous namespace)::readSnippet(const std::string &)");
}

Assistant:

std::string readSnippet( std::string const & snippetFile )
  {
    std::ifstream ifs( std::string( BASE_PATH ) + "/snippets/" + snippetFile );
    assert( !ifs.fail() );
    std::ostringstream oss;
    oss << ifs.rdbuf();
    return oss.str();
  }